

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

void __thiscall argparse::Argument::validate(Argument *this)

{
  byte bVar1;
  size_t sVar2;
  pointer pbVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  long lVar6;
  stringstream stream;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  lVar6 = (long)this->mNumArgs;
  if (lVar6 < 0) {
    return;
  }
  bVar1 = this->field_0xac;
  if ((bVar1 & 1) == 0) {
    if (-1 < this->mNumArgs &&
        (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == lVar6) {
      return;
    }
    if ((this->mDefaultValue)._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    sVar2 = (this->mUsedName)._M_len;
    if (sVar2 != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_198,(this->mUsedName)._M_str,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    }
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," argument(s) expected. ",0x17);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," provided.",10);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((bVar1 & 4) != 0) {
    if (((long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_start >> 4 != lVar6) &&
       ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0)) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_198,(this->mUsedName)._M_str,(this->mUsedName)._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": expected ",0xb);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," argument(s). ",0xe);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," provided.",10);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,asStack_1c8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((bVar1 & 4) != 0) goto LAB_0011af57;
  }
  if (((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) &&
     ((bVar1 & 2) != 0)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    pbVar3 = (this->mNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": required.",0xb);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0011af57:
  if (((~bVar1 & 6) == 0) &&
     ((this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(this->mUsedName)._M_str,(this->mUsedName)._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": no value provided.",0x14);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar5,asStack_1c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

auto maybe_nargs() const -> std::optional<size_t> {
    if (mNumArgs < 0)
      return std::nullopt;
    else
      return static_cast<size_t>(mNumArgs);
  }